

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::up_down_position(Fl_Input_ *this,int i,int keepmark)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *p;
  int p_00;
  char *pcVar4;
  double dVar5;
  char buf [1024];
  
  setfont(this);
  p = this->value_ + i;
  pcVar3 = expand(this,p,buf);
  pcVar1 = p;
  while (pcVar4 = pcVar1, pcVar4 < pcVar3) {
    dVar5 = expandpos(this,p,pcVar4 + (long)(pcVar3 + (1 - (long)pcVar4)) / 2,buf,(int *)0x0);
    pcVar1 = pcVar4 + (long)(pcVar3 + (1 - (long)pcVar4)) / 2;
    if (up_down_pos < (double)(int)dVar5) {
      pcVar3 = pcVar4 + (long)(pcVar3 + (1 - (long)pcVar4)) / 2 + -1;
      pcVar1 = pcVar4;
    }
  }
  p_00 = (int)pcVar4 - *(int *)&this->value_;
  iVar2 = p_00;
  if (keepmark != 0) {
    iVar2 = this->mark_;
  }
  iVar2 = position(this,p_00,iVar2);
  was_up_down = 1;
  return iVar2;
}

Assistant:

int Fl_Input_::up_down_position(int i, int keepmark) {
  // unlike before, i must be at the start of the line already!

  setfont();
  char buf[MAXBUF];
  const char* p = value()+i;
  const char* e = expand(p, buf);
  const char *l, *r, *t;
  for (l = p, r = e; l<r; ) {
    t = l+(r-l+1)/2;
    int f = (int)expandpos(p, t, buf, 0);
    if (f <= up_down_pos) l = t; else r = t-1;
  }
  int j = (int) (l-value());
  j = position(j, keepmark ? mark_ : j);
  was_up_down = 1;
  return j;
}